

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

void soul::SourceCodeUtilities::iterateSyntaxTokens
               (CodeLocation *start,
               function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *handleToken)

{
  UTF8Reader UVar1;
  TokenType __s1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  UTF8Reader __s;
  size_type __rlen;
  size_t __n;
  size_t sVar5;
  char *__s1_00;
  SimpleTokeniser tokeniser;
  char *local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  local_a8;
  
  local_f8 = (char *)0x0;
  SimpleTokeniser::SimpleTokeniser((SimpleTokeniser *)&local_a8,start,false);
  __s.data = (start->location).data;
  sVar5 = 0;
  do {
    __s1.text = local_a8.currentType.text;
    if ((local_a8.currentType.text == "$eof") ||
       ((local_a8.currentType.text != (char *)0x0 &&
        (iVar3 = strcmp(local_a8.currentType.text,"$eof"), iVar3 == 0)))) break;
    UVar1.data = local_a8.location.location.data;
    if (((((((__s1.text == "if") ||
            ((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,"if"), __s1.text == "do" || (iVar3 == 0)))))) ||
           ((__s1.text != (char *)0x0 &&
            ((iVar3 = strcmp(__s1.text,"do"), __s1.text == "for" || (iVar3 == 0)))))) ||
          ((((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,"for"), __s1.text == "let" || (iVar3 == 0)))) ||
            ((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,"let"), __s1.text == "var" || (iVar3 == 0)))))) ||
           ((__s1.text != (char *)0x0 &&
            ((iVar3 = strcmp(__s1.text,"var"), __s1.text == "int" || (iVar3 == 0)))))))) ||
         (((__s1.text != (char *)0x0 &&
           ((iVar3 = strcmp(__s1.text,"int"), __s1.text == "try" || (iVar3 == 0)))) ||
          ((((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,"try"), __s1.text == "else" || (iVar3 == 0)))) ||
            ((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,"else"), __s1.text == "bool" || (iVar3 == 0)))))) ||
           ((((__s1.text != (char *)0x0 &&
              ((iVar3 = strcmp(__s1.text,"bool"), __s1.text == "true" || (iVar3 == 0)))) ||
             ((__s1.text != (char *)0x0 &&
              ((iVar3 = strcmp(__s1.text,"true"), __s1.text == "case" || (iVar3 == 0)))))) ||
            ((((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,"case"), __s1.text == "enum" || (iVar3 == 0)))) ||
              ((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,"enum"), __s1.text == "loop" || (iVar3 == 0)))))) ||
             ((__s1.text != (char *)0x0 &&
              ((iVar3 = strcmp(__s1.text,"loop"), __s1.text == "void" || (iVar3 == 0))))))))))))))
        || (((((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,"void"), __s1.text == "while" || (iVar3 == 0)))) ||
              ((((((((__s1.text != (char *)0x0 &&
                     ((iVar3 = strcmp(__s1.text,"while"), __s1.text == "break" || (iVar3 == 0)))) ||
                    ((__s1.text != (char *)0x0 &&
                     ((iVar3 = strcmp(__s1.text,"break"), __s1.text == "const" || (iVar3 == 0))))))
                   || ((__s1.text != (char *)0x0 &&
                       ((iVar3 = strcmp(__s1.text,"const"), __s1.text == "int32" || (iVar3 == 0)))))
                   ) || ((__s1.text != (char *)0x0 &&
                         ((iVar3 = strcmp(__s1.text,"int32"), __s1.text == "int64" || (iVar3 == 0)))
                         ))) ||
                 (((__s1.text != (char *)0x0 &&
                   ((iVar3 = strcmp(__s1.text,"int64"), __s1.text == "float" || (iVar3 == 0)))) ||
                  ((__s1.text != (char *)0x0 &&
                   ((iVar3 = strcmp(__s1.text,"float"), __s1.text == "false" || (iVar3 == 0))))))))
                || ((((__s1.text != (char *)0x0 &&
                      ((iVar3 = strcmp(__s1.text,"false"), __s1.text == "using" || (iVar3 == 0))))
                     || ((__s1.text != (char *)0x0 &&
                         ((iVar3 = strcmp(__s1.text,"using"), __s1.text == "fixed" || (iVar3 == 0)))
                         ))) ||
                    ((((__s1.text != (char *)0x0 &&
                       ((iVar3 = strcmp(__s1.text,"fixed"), __s1.text == "graph" || (iVar3 == 0))))
                      || ((__s1.text != (char *)0x0 &&
                          ((iVar3 = strcmp(__s1.text,"graph"), __s1.text == "input" || (iVar3 == 0))
                          )))) ||
                     (((__s1.text != (char *)0x0 &&
                       ((iVar3 = strcmp(__s1.text,"input"), __s1.text == "event" || (iVar3 == 0))))
                      || ((__s1.text != (char *)0x0 &&
                          ((iVar3 = strcmp(__s1.text,"event"), __s1.text == "class" || (iVar3 == 0))
                          )))))))))) ||
               ((((__s1.text != (char *)0x0 &&
                  ((iVar3 = strcmp(__s1.text,"class"), __s1.text == "catch" || (iVar3 == 0)))) ||
                 ((__s1.text != (char *)0x0 &&
                  ((iVar3 = strcmp(__s1.text,"catch"), __s1.text == "throw" || (iVar3 == 0)))))) ||
                ((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"throw"), __s1.text == "output" || (iVar3 == 0))))))))))
             || (((__s1.text != (char *)0x0 &&
                  ((iVar3 = strcmp(__s1.text,"output"), __s1.text == "return" || (iVar3 == 0)))) ||
                 (((((((__s1.text != (char *)0x0 &&
                       ((iVar3 = strcmp(__s1.text,"return"), __s1.text == "string" || (iVar3 == 0)))
                       ) || ((__s1.text != (char *)0x0 &&
                             ((iVar3 = strcmp(__s1.text,"string"), __s1.text == "struct" ||
                              (iVar3 == 0)))))) ||
                     ((__s1.text != (char *)0x0 &&
                      ((iVar3 = strcmp(__s1.text,"struct"), __s1.text == "import" || (iVar3 == 0))))
                     )) || (((__s1.text != (char *)0x0 &&
                             ((iVar3 = strcmp(__s1.text,"import"), __s1.text == "switch" ||
                              (iVar3 == 0)))) ||
                            (((__s1.text != (char *)0x0 &&
                              ((iVar3 = strcmp(__s1.text,"switch"), __s1.text == "public" ||
                               (iVar3 == 0)))) ||
                             ((__s1.text != (char *)0x0 &&
                              ((iVar3 = strcmp(__s1.text,"public"), __s1.text == "double" ||
                               (iVar3 == 0)))))))))) ||
                   ((__s1.text != (char *)0x0 &&
                    ((iVar3 = strcmp(__s1.text,"double"), __s1.text == "private" || (iVar3 == 0)))))
                   ) || (((__s1.text != (char *)0x0 &&
                          ((iVar3 = strcmp(__s1.text,"private"), __s1.text == "float32" ||
                           (iVar3 == 0)))) ||
                         (((((__s1.text != (char *)0x0 &&
                             ((iVar3 = strcmp(__s1.text,"float32"), __s1.text == "float64" ||
                              (iVar3 == 0)))) ||
                            ((__s1.text != (char *)0x0 &&
                             ((iVar3 = strcmp(__s1.text,"float64"), __s1.text == "default" ||
                              (iVar3 == 0)))))) ||
                           ((__s1.text != (char *)0x0 &&
                            ((iVar3 = strcmp(__s1.text,"default"), __s1.text == "complex" ||
                             (iVar3 == 0)))))) ||
                          ((__s1.text != (char *)0x0 &&
                           ((iVar3 = strcmp(__s1.text,"complex"), __s1.text == "continue" ||
                            (iVar3 == 0)))))))))))))) ||
            ((((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,"continue"), __s1.text == "external" || (iVar3 == 0)))) ||
              ((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,"external"), __s1.text == "operator" || (iVar3 == 0))))))
             || (((__s1.text != (char *)0x0 &&
                  ((iVar3 = strcmp(__s1.text,"operator"), __s1.text == "processor" || (iVar3 == 0)))
                  ) || ((__s1.text != (char *)0x0 &&
                        ((iVar3 = strcmp(__s1.text,"processor"), __s1.text == "namespace" ||
                         (iVar3 == 0)))))))))))) ||
       ((((__s1.text != (char *)0x0 &&
          ((iVar3 = strcmp(__s1.text,"namespace"), __s1.text == "complex32" || (iVar3 == 0)))) ||
         ((__s1.text != (char *)0x0 &&
          ((iVar3 = strcmp(__s1.text,"complex32"), __s1.text == "complex64" || (iVar3 == 0)))))) ||
        (((__s1.text != (char *)0x0 &&
          ((iVar3 = strcmp(__s1.text,"complex64"), __s1.text == "connection" || (iVar3 == 0)))) ||
         ((__s1.text != (char *)0x0 && (iVar3 = strcmp(__s1.text,"connection"), iVar3 == 0)))))))) {
      __n = 0xc;
      __s1_00 = "hljs-keyword";
    }
    else {
      __n = 0xd;
      if (((((__s1.text == ";") ||
            ((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,";"), __s1.text == "." || (iVar3 == 0)))))) ||
           ((__s1.text != (char *)0x0 &&
            ((iVar3 = strcmp(__s1.text,"."), __s1.text == "," || (iVar3 == 0)))))) ||
          (((((((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,","), __s1.text == "(" || (iVar3 == 0)))) ||
               ((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"("), __s1.text == ")" || (iVar3 == 0)))))) ||
              ((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,")"), __s1.text == "{" || (iVar3 == 0)))))) ||
             ((__s1.text != (char *)0x0 &&
              ((iVar3 = strcmp(__s1.text,"{"), __s1.text == "}" || (iVar3 == 0)))))) ||
            (((((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"}"), __s1.text == "[[" || (iVar3 == 0)))) ||
               ((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"[["), __s1.text == "]]" || (iVar3 == 0)))))) ||
              (((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"]]"), __s1.text == "[" || (iVar3 == 0)))) ||
               ((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"["), __s1.text == "]" || (iVar3 == 0)))))))) ||
             ((((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"]"), __s1.text == "::" || (iVar3 == 0)))) ||
               ((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"::"), __s1.text == ":" || (iVar3 == 0)))))) ||
              ((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,":"), __s1.text == "?" || (iVar3 == 0)))))))))) ||
           (((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,"?"), __s1.text == "==" || (iVar3 == 0)))) ||
            (((((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"=="), __s1.text == "=" || (iVar3 == 0)))) ||
               ((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"="), __s1.text == "!=" || (iVar3 == 0)))))) ||
              ((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,"!="), __s1.text == "!" || (iVar3 == 0)))))) ||
             ((__s1.text != (char *)0x0 &&
              ((iVar3 = strcmp(__s1.text,"!"), __s1.text == "+=" || (iVar3 == 0)))))))))))) ||
         (((((((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,"+="), __s1.text == "++" || (iVar3 == 0)))) ||
              ((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,"++"), __s1.text == "+" || (iVar3 == 0)))))) ||
             ((__s1.text != (char *)0x0 &&
              ((iVar3 = strcmp(__s1.text,"+"), __s1.text == "-=" || (iVar3 == 0)))))) ||
            (((__s1.text != (char *)0x0 &&
              ((iVar3 = strcmp(__s1.text,"-="), __s1.text == "--" || (iVar3 == 0)))) ||
             ((((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"--"), __s1.text == "->" || (iVar3 == 0)))) ||
               ((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"->"), __s1.text == "-" || (iVar3 == 0)))))) ||
              ((((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"-"), __s1.text == "*=" || (iVar3 == 0)))) ||
                ((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"*="), __s1.text == "*" || (iVar3 == 0)))))) ||
               ((((__s1.text != (char *)0x0 &&
                  ((iVar3 = strcmp(__s1.text,"*"), __s1.text == "/=" || (iVar3 == 0)))) ||
                 ((__s1.text != (char *)0x0 &&
                  ((iVar3 = strcmp(__s1.text,"/="), __s1.text == "/" || (iVar3 == 0)))))) ||
                ((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"/"), __s1.text == "%=" || (iVar3 == 0)))))))))))))) ||
           ((__s1.text != (char *)0x0 &&
            ((iVar3 = strcmp(__s1.text,"%="), __s1.text == "%" || (iVar3 == 0)))))) ||
          (((((((((((__s1.text != (char *)0x0 &&
                    ((iVar3 = strcmp(__s1.text,"%"), __s1.text == "^=" || (iVar3 == 0)))) ||
                   ((__s1.text != (char *)0x0 &&
                    ((iVar3 = strcmp(__s1.text,"^="), __s1.text == "^" || (iVar3 == 0)))))) ||
                  ((__s1.text != (char *)0x0 &&
                   ((iVar3 = strcmp(__s1.text,"^"), __s1.text == "&=" || (iVar3 == 0)))))) ||
                 (((__s1.text != (char *)0x0 &&
                   ((iVar3 = strcmp(__s1.text,"&="), __s1.text == "&&=" || (iVar3 == 0)))) ||
                  (((__s1.text != (char *)0x0 &&
                    ((iVar3 = strcmp(__s1.text,"&&="), __s1.text == "&&" || (iVar3 == 0)))) ||
                   ((__s1.text != (char *)0x0 &&
                    ((iVar3 = strcmp(__s1.text,"&&"), __s1.text == "&" || (iVar3 == 0)))))))))) ||
                ((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"&"), __s1.text == "|=" || (iVar3 == 0)))))) ||
               ((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"|="), __s1.text == "||=" || (iVar3 == 0)))))) ||
              ((((((__s1.text != (char *)0x0 &&
                   ((iVar3 = strcmp(__s1.text,"||="), __s1.text == "||" || (iVar3 == 0)))) ||
                  ((__s1.text != (char *)0x0 &&
                   ((iVar3 = strcmp(__s1.text,"||"), __s1.text == "|" || (iVar3 == 0)))))) ||
                 ((__s1.text != (char *)0x0 &&
                  ((iVar3 = strcmp(__s1.text,"|"), __s1.text == "~" || (iVar3 == 0)))))) ||
                ((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"~"), __s1.text == "<<=" || (iVar3 == 0)))))) ||
               (((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"<<="), __s1.text == "<<" || (iVar3 == 0)))) ||
                ((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"<<"), __s1.text == "<=" || (iVar3 == 0)))))))))) ||
             ((__s1.text != (char *)0x0 &&
              ((iVar3 = strcmp(__s1.text,"<="), __s1.text == "<" || (iVar3 == 0)))))) ||
            ((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,"<"), __s1.text == ">>>=" || (iVar3 == 0)))))) ||
           (((((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,">>>="), __s1.text == ">>=" || (iVar3 == 0)))) ||
              ((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,">>="), __s1.text == ">>>" || (iVar3 == 0)))))) ||
             (((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,">>>"), __s1.text == ">>" || (iVar3 == 0)))) ||
              ((__s1.text != (char *)0x0 &&
               ((iVar3 = strcmp(__s1.text,">>"), __s1.text == ">=" || (iVar3 == 0)))))))) ||
            ((__s1.text != (char *)0x0 &&
             ((iVar3 = strcmp(__s1.text,">="), __s1.text == ">" || (iVar3 == 0)))))))))))) {
        __s1_00 = "hljs-operator";
      }
      else {
        if (__s1.text != (char *)0x0) {
          iVar3 = strcmp(__s1.text,">");
          __s1_00 = "hljs-operator";
          if (iVar3 == 0) goto LAB_001b6e53;
        }
        __n = 9;
        if (__s1.text == "$identifier") {
          __s1_00 = "hljs-name";
        }
        else {
          if (__s1.text != (char *)0x0) {
            iVar3 = strcmp(__s1.text,"$identifier");
            __s1_00 = "hljs-name";
            if (iVar3 == 0) goto LAB_001b6e53;
          }
          __n = 0xb;
          if (((((__s1.text == "$integer32") ||
                ((__s1.text != (char *)0x0 &&
                 ((iVar3 = strcmp(__s1.text,"$integer32"), __s1.text == "$integer64" || (iVar3 == 0)
                  ))))) ||
               ((__s1.text != (char *)0x0 &&
                ((iVar3 = strcmp(__s1.text,"$integer64"), __s1.text == "$float32" || (iVar3 == 0))))
               )) || ((((__s1.text != (char *)0x0 &&
                        ((iVar3 = strcmp(__s1.text,"$float32"), __s1.text == "$float64" ||
                         (iVar3 == 0)))) ||
                       ((__s1.text != (char *)0x0 &&
                        ((iVar3 = strcmp(__s1.text,"$float64"), __s1.text == "$imag32" ||
                         (iVar3 == 0)))))) ||
                      ((__s1.text != (char *)0x0 &&
                       ((iVar3 = strcmp(__s1.text,"$imag32"), __s1.text == "$imag64" || (iVar3 == 0)
                        ))))))) ||
             ((__s1.text != (char *)0x0 && (iVar3 = strcmp(__s1.text,"$imag64"), iVar3 == 0)))) {
            __s1_00 = "hljs-number";
          }
          else if (__s1.text == "$string literal") {
            __s1_00 = "hljs-string";
          }
          else {
            if (__s1.text != (char *)0x0) {
              iVar3 = strcmp(__s1.text,"$string literal");
              __s1_00 = "hljs-string";
              if (iVar3 == 0) goto LAB_001b6e53;
            }
            if (__s1.text == "$comment") {
              __n = 0xc;
              __s1_00 = "hljs-comment";
            }
            else {
              if (__s1.text != (char *)0x0) {
                iVar3 = strcmp(__s1.text,"$comment");
                __n = 0xc;
                __s1_00 = "hljs-comment";
                if (iVar3 == 0) goto LAB_001b6e53;
              }
              __n = 4;
              __s1_00 = "hljs";
            }
          }
        }
      }
    }
LAB_001b6e53:
    if ((__n == sVar5) && (iVar3 = bcmp(__s1_00,local_f8,__n), iVar3 == 0)) {
LAB_001b6ec7:
      iVar3 = 0;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&local_a8);
    }
    else {
      sVar4 = (long)UVar1.data - (long)__s.data;
      if (sVar4 == 0) {
LAB_001b6eac:
        iVar3 = 0;
        bVar2 = true;
        __s.data = UVar1.data;
        sVar5 = __n;
        local_f8 = __s1_00;
      }
      else {
        local_e8._M_str = local_f8;
        local_e8._M_len = sVar5;
        local_d8._M_len = sVar4;
        local_d8._M_str = __s.data;
        if ((handleToken->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar2 = (*handleToken->_M_invoker)((_Any_data *)handleToken,&local_d8,&local_e8);
        if (bVar2) goto LAB_001b6eac;
        iVar3 = 3;
        bVar2 = false;
      }
      if (bVar2) goto LAB_001b6ec7;
    }
  } while (iVar3 == 0);
  if (*__s.data != '\0') {
    local_b8._M_len = strlen(__s.data);
    local_c8._M_str = local_f8;
    local_c8._M_len = sVar5;
    local_b8._M_str = __s.data;
    if ((handleToken->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*handleToken->_M_invoker)((_Any_data *)handleToken,&local_b8,&local_c8);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::~Tokeniser(&local_a8);
  return;
}

Assistant:

void SourceCodeUtilities::iterateSyntaxTokens (CodeLocation start,
                                               const std::function<bool(std::string_view, std::string_view)>& handleToken)
{
    auto getTokenType = [] (TokenType t) -> std::string_view
    {
       #define SOUL_COMPARE_KEYWORD(name, str) if (t == Keyword::name) return "hljs-keyword";
        SOUL_KEYWORDS (SOUL_COMPARE_KEYWORD)
       #undef SOUL_COMPARE_KEYWORD

       #define SOUL_COMPARE_OPERATOR(name, str) if (t == Operator::name) return "hljs-operator";
        SOUL_OPERATORS (SOUL_COMPARE_OPERATOR)
       #undef SOUL_COMPARE_OPERATOR

        if (t == Token::identifier)      return "hljs-name";
        if (t == Token::literalInt32)    return "hljs-number";
        if (t == Token::literalInt64)    return "hljs-number";
        if (t == Token::literalFloat32)  return "hljs-number";
        if (t == Token::literalFloat64)  return "hljs-number";
        if (t == Token::literalImag32)   return "hljs-number";
        if (t == Token::literalImag64)   return "hljs-number";
        if (t == Token::literalString)   return "hljs-string";
        if (t == Token::comment)         return "hljs-comment";

        return "hljs";
    };

    SimpleTokeniser tokeniser (start, false);
    auto currentSectionStart = start.location;
    std::string_view currentTokenType;

    try
    {
        while (! tokeniser.matches (Token::eof))
        {
            auto newPos = tokeniser.location.location;
            auto newType = getTokenType (tokeniser.currentType);

            if (newType != currentTokenType)
            {
                std::string_view tokenText (currentSectionStart.getAddress(),
                                            static_cast<size_t> (newPos.getAddress() - currentSectionStart.getAddress()));

                if (! tokenText.empty())
                    if (! handleToken (tokenText, currentTokenType))
                        break;

                currentSectionStart = newPos;
                currentTokenType = newType;
            }

            tokeniser.skip();
        }
    }
    catch (const AbortCompilationException&) {}

    if (currentSectionStart.isNotEmpty())
        handleToken (currentSectionStart.getAddress(), currentTokenType);
}